

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
          *this,quad<unsigned_char> *param_1)

{
  byte bVar1;
  pixel_type pVar2;
  pixel_type pVar3;
  pixel_type pVar4;
  pixel_type pVar5;
  quad<unsigned_char> qs;
  sample_type sVar6;
  anon_union_1_2_7f9ecb5c_for_quad<unsigned_char>_2 aVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 local_40;
  sample_type sStack_3f;
  sample_type sStack_3e;
  anon_union_1_2_7f9ecb5c_for_quad<unsigned_char>_2 aStack_3d;
  int32_t local_3c;
  quad<unsigned_char> rx;
  int32_t qs4;
  int32_t qs3;
  int32_t qs2;
  int32_t qs1;
  quad<unsigned_char> rd;
  quad<unsigned_char> rb;
  quad<unsigned_char> rc;
  quad<unsigned_char> ra;
  int32_t index;
  quad<unsigned_char> *param_1_local;
  jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
  *this_local;
  
  rc.super_triplet<unsigned_char>.field_0 =
       (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)0x0;
  rc.super_triplet<unsigned_char>.field_1 =
       (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)0x0;
  rc.super_triplet<unsigned_char>.field_2 =
       (anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5)0x0;
  rc.field_0 = (anon_union_1_2_7f9ecb5c_for_quad<unsigned_char>_2)0x0;
  while ((uint)rc < this->width_) {
    pVar2 = this->current_line_[(int)rc + -1];
    pVar3 = this->previous_line_[(int)rc + -1];
    pVar4 = this->previous_line_[(int)rc];
    pVar5 = this->previous_line_[(int)rc + 1];
    iVar8 = quantize_gradient(this,((uint)pVar5 & 0xff) - ((uint)pVar4 & 0xff));
    iVar9 = quantize_gradient(this,((uint)pVar4 & 0xff) - ((uint)pVar3 & 0xff));
    iVar10 = quantize_gradient(this,((uint)pVar3 & 0xff) - ((uint)pVar2 & 0xff));
    iVar8 = compute_context_id(iVar8,iVar9,iVar10);
    qs1._1_1_ = pVar4.super_triplet<unsigned_char>.field_1;
    iVar9 = quantize_gradient(this,((uint)pVar5 >> 8 & 0xff) - (uint)qs1._1_1_);
    rd.super_triplet<unsigned_char>.field_1.v2 = pVar3.super_triplet<unsigned_char>.field_1;
    iVar10 = quantize_gradient(this,(uint)qs1._1_1_ -
                                    (uint)rd.super_triplet<unsigned_char>.field_1.v2);
    rb.super_triplet<unsigned_char>.field_1.v2 = pVar2.super_triplet<unsigned_char>.field_1;
    iVar11 = quantize_gradient(this,(uint)rd.super_triplet<unsigned_char>.field_1.v2 -
                                    (uint)rb.super_triplet<unsigned_char>.field_1.v2);
    iVar9 = compute_context_id(iVar9,iVar10,iVar11);
    qs1._2_1_ = pVar4.super_triplet<unsigned_char>.field_2;
    iVar10 = quantize_gradient(this,((uint)pVar5 >> 0x10 & 0xff) - (uint)qs1._2_1_);
    rd.super_triplet<unsigned_char>.field_2.v3 = pVar3.super_triplet<unsigned_char>.field_2;
    iVar11 = quantize_gradient(this,(uint)qs1._2_1_ -
                                    (uint)rd.super_triplet<unsigned_char>.field_2.v3);
    rb.super_triplet<unsigned_char>.field_2.v3 = pVar2.super_triplet<unsigned_char>.field_2;
    iVar12 = quantize_gradient(this,(uint)rd.super_triplet<unsigned_char>.field_2.v3 -
                                    (uint)rb.super_triplet<unsigned_char>.field_2.v3);
    rx = (quad<unsigned_char>)compute_context_id(iVar10,iVar11,iVar12);
    qs1._3_1_ = pVar4.field_0;
    iVar10 = quantize_gradient(this,((uint)pVar5 >> 0x18) - (uint)qs1._3_1_);
    rd.field_0 = pVar3.field_0;
    iVar11 = quantize_gradient(this,(uint)qs1._3_1_ - (uint)rd.field_0.v4);
    rb.field_0 = pVar2.field_0;
    iVar12 = quantize_gradient(this,(uint)rd.field_0.v4 - (uint)rb.field_0.v4);
    local_3c = compute_context_id(iVar10,iVar11,iVar12);
    if ((((iVar8 == 0) && (iVar9 == 0)) && (rx == (quad<unsigned_char>)0x0)) && (local_3c == 0)) {
      iVar8 = do_run_mode(this,(int32_t)rc,(encoder_strategy *)0x0);
      rc = (quad<unsigned_char>)(iVar8 + (int)rc);
    }
    else {
      quad<unsigned_char>::quad((quad<unsigned_char> *)&local_40);
      bVar1 = this->current_line_[(int)rc].super_triplet<unsigned_char>.field_0.v1;
      iVar10 = get_predicted_value((uint)pVar2 & 0xff,(uint)pVar4 & 0xff,(uint)pVar3 & 0xff);
      sVar6 = do_regular(this,iVar8,(uint)bVar1,iVar10,(encoder_strategy *)0x0);
      _local_40 = (pixel_type)CONCAT31(_sStack_3f,sVar6);
      bVar1 = this->current_line_[(int)rc].super_triplet<unsigned_char>.field_1.v2;
      iVar8 = get_predicted_value((uint)rb.super_triplet<unsigned_char>.field_1.v2,(uint)qs1._1_1_,
                                  (uint)rd.super_triplet<unsigned_char>.field_1.v2);
      sVar6 = do_regular(this,iVar9,(uint)bVar1,iVar8,(encoder_strategy *)0x0);
      qs = rx;
      _local_40 = CONCAT11(sVar6,local_40.v1);
      bVar1 = this->current_line_[(int)rc].super_triplet<unsigned_char>.field_2.v3;
      iVar8 = get_predicted_value((uint)rb.super_triplet<unsigned_char>.field_2.v3,(uint)qs1._2_1_,
                                  (uint)rd.super_triplet<unsigned_char>.field_2.v3);
      sVar6 = do_regular(this,(int32_t)qs,(uint)bVar1,iVar8,(encoder_strategy *)0x0);
      iVar8 = local_3c;
      _local_40 = (triplet<unsigned_char>)CONCAT12(sVar6,_local_40);
      bVar1 = this->current_line_[(int)rc].field_0.v4;
      iVar9 = get_predicted_value((uint)rb.field_0.v4,(uint)qs1._3_1_,(uint)rd.field_0.v4);
      aVar7.v4 = do_regular(this,iVar8,(uint)bVar1,iVar9,(encoder_strategy *)0x0);
      aStack_3d.v4 = aVar7.v4;
      this->current_line_[(int)rc] = _local_40;
      rc = (quad<unsigned_char>)((int)rc + 1);
    }
  }
  return;
}

Assistant:

void do_line(quad<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const quad<sample_type> ra{current_line_[index - 1]};
            const quad<sample_type> rc{previous_line_[index - 1]};
            const quad<sample_type> rb{previous_line_[index]};
            const quad<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};
            const int32_t qs4{compute_context_id(quantize_gradient(rd.v4 - rb.v4), quantize_gradient(rb.v4 - rc.v4),
                                                 quantize_gradient(rc.v4 - ra.v4))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0 && qs4 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                quad<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                rx.v4 = do_regular(qs4, current_line_[index].v4, get_predicted_value(ra.v4, rb.v4, rc.v4),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }